

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O3

void __thiscall SemanticTables::visit(SemanticTables *this,ProgramNode *programNode)

{
  TypeDeclNode *pTVar1;
  VarDeclNode *pVVar2;
  FunctionListNode *pFVar3;
  
  pTVar1 = programNode->typelist;
  if (pTVar1 != (TypeDeclNode *)0x0) {
    (*(pTVar1->super_ASTNode)._vptr_ASTNode[3])(pTVar1,this);
  }
  pVVar2 = programNode->varlist;
  if (pVVar2 != (VarDeclNode *)0x0) {
    (*(pVVar2->super_ASTNode)._vptr_ASTNode[3])(pVVar2,this);
  }
  pFVar3 = programNode->functions;
  if (pFVar3 != (FunctionListNode *)0x0) {
    (*(pFVar3->super_ASTNode)._vptr_ASTNode[3])(pFVar3,this);
    return;
  }
  return;
}

Assistant:

void SemanticTables::visit(ProgramNode *programNode) {
    if (programNode->getTypeList()) {
        programNode->getTypeList()->accept(this);
    }
    if (programNode->getVarList()) {
        programNode->getVarList()->accept(this);
    }
    if (programNode->getFunctions()) {
        programNode->getFunctions()->accept(this);
    }
}